

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,ICmpInst *value,bool decl)

{
  Predicate pred;
  uint64_t local_48;
  Value *local_40;
  Value *local_38;
  char *local_30;
  uint64_t local_28;
  undefined1 local_19;
  CmpInst *pCStack_18;
  bool decl_local;
  ICmpInst *value_local;
  StreamState *this_local;
  
  local_19 = decl;
  pCStack_18 = &value->super_CmpInst;
  value_local = (ICmpInst *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)value);
    pred = CmpInst::getPredicate(pCStack_18);
    local_30 = to_string(pred);
    local_38 = Instruction::getOperand(&pCStack_18->super_Instruction,0);
    local_40 = Instruction::getOperand(&pCStack_18->super_Instruction,1);
    append<char_const(&)[2],unsigned_long,char_const(&)[9],char_const*,char_const(&)[2],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*>
              (this,(char (*) [2])0x2a90be,&local_28,(char (*) [9])" = icmp ",&local_30,
               (char (*) [2])0x2a8f72,&local_38,(char (*) [3])", ",&local_40);
  }
  else {
    local_48 = Value::get_tween_id((Value *)value);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_48);
  }
  return;
}

Assistant:

void StreamState::append(ICmpInst *value, bool decl)
{
	if (decl)
	{
		append("%", value->get_tween_id(), " = icmp ", to_string(value->getPredicate()), " ", value->getOperand(0),
		       ", ", value->getOperand(1));
	}
	else
	{
		append("%", value->get_tween_id());
	}
}